

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O3

void gl4cts::RobustnessRobustBufferAccessBehavior::Texture::Image
               (Functions *gl,GLenum target,GLint level,GLenum internal_format,GLuint width,
               GLuint height,GLuint depth,GLenum format,GLenum type,GLvoid *data)

{
  GLenum err;
  TestError *this;
  int line;
  char *msg;
  
  if ((int)target < 0x84f5) {
    if (target == 0xde0) {
      (*gl->texImage1D)(0xde0,level,internal_format,width,0,format,type,data);
      err = (*gl->getError)();
      msg = "TexImage1D";
      line = 0x3d0;
      goto LAB_008c6fdd;
    }
    if (target != 0xde1) {
      if (target != 0x806f) goto LAB_008c6ed5;
      goto LAB_008c6f26;
    }
  }
  else if ((int)target < 0x8c18) {
    if (target != 0x84f5) {
      if (target != 0x8513) {
LAB_008c6ed5:
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invliad enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                   ,0x3f1);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*gl->texImage2D)(0x8515,level,internal_format,width,height,0,format,type,data);
      (*gl->texImage2D)(0x8516,level,internal_format,width,height,0,format,type,data);
      (*gl->texImage2D)(0x8517,level,internal_format,width,height,0,format,type,data);
      (*gl->texImage2D)(0x8518,level,internal_format,width,height,0,format,type,data);
      (*gl->texImage2D)(0x8519,level,internal_format,width,height,0,format,type,data);
      (*gl->texImage2D)(0x851a,level,internal_format,width,height,0,format,type,data);
      err = (*gl->getError)();
      msg = "TexImage2D";
      line = 999;
      goto LAB_008c6fdd;
    }
  }
  else if (target != 0x8c18) {
    if (target != 0x8c1a) goto LAB_008c6ed5;
LAB_008c6f26:
    (*gl->texImage3D)(target,level,internal_format,width,height,depth,0,format,type,data);
    err = (*gl->getError)();
    msg = "TexImage3D";
    line = 0x3ed;
    goto LAB_008c6fdd;
  }
  (*gl->texImage2D)(target,level,internal_format,width,height,0,format,type,data);
  err = (*gl->getError)();
  msg = "TexImage2D";
  line = 0x3d7;
LAB_008c6fdd:
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,line);
  return;
}

Assistant:

void Texture::Image(const glw::Functions& gl, glw::GLenum target, glw::GLint level, glw::GLenum internal_format,
					glw::GLuint width, glw::GLuint height, glw::GLuint depth, glw::GLenum format, glw::GLenum type,
					const glw::GLvoid* data)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texImage1D(target, level, internal_format, width, 0 /* border */, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage1D");
		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texImage2D(target, level, internal_format, width, height, 0 /* border */, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage2D");
		break;

	case GL_TEXTURE_CUBE_MAP:
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, level, internal_format, width, height, 0 /* border */, format,
					  type, data);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, level, internal_format, width, height, 0 /* border */, format,
					  type, data);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, level, internal_format, width, height, 0 /* border */, format,
					  type, data);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, level, internal_format, width, height, 0 /* border */, format,
					  type, data);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, level, internal_format, width, height, 0 /* border */, format,
					  type, data);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, level, internal_format, width, height, 0 /* border */, format,
					  type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage2D");
		break;

	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
		gl.texImage3D(target, level, internal_format, width, height, depth, 0 /* border */, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage3D");
		break;

	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}